

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tty.c
# Opt level: O2

int luv_new_tty(lua_State *L)

{
  int iVar1;
  lua_Integer lVar2;
  uv_tty_t *tty;
  uv_loop_t *loop;
  luv_handle_t *plVar3;
  int iVar4;
  
  iVar4 = 1;
  lVar2 = luaL_checkinteger(L,1);
  luaL_checktype(L,2,1);
  iVar1 = lua_toboolean(L,2);
  tty = (uv_tty_t *)luv_newuserdata(L,0x138);
  loop = luv_loop(L);
  iVar1 = uv_tty_init(loop,tty,(int)lVar2,iVar1);
  if (iVar1 < 0) {
    lua_settop(L,-2);
    luv_error(L,iVar1);
    iVar4 = 3;
  }
  else {
    plVar3 = luv_setup_handle(L);
    tty->data = plVar3;
  }
  return iVar4;
}

Assistant:

static int luv_new_tty(lua_State* L) {
  int readable, ret;
  uv_tty_t* handle;
  luv_ctx_t* ctx = luv_context(L);
  uv_file fd = luaL_checkinteger(L, 1);
  luaL_checktype(L, 2, LUA_TBOOLEAN);
  readable = lua_toboolean(L, 2);
  handle = (uv_tty_t*)luv_newuserdata(L, sizeof(*handle));
  ret = uv_tty_init(ctx->loop, handle, fd, readable);
  if (ret < 0) {
    lua_pop(L, 1);
    return luv_error(L, ret);
  }
  handle->data = luv_setup_handle(L, ctx);
  return 1;
}